

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

Polygon * ClipperLib::BuildArc
                    (Polygon *__return_storage_ptr__,IntPoint *pt,double a1,double a2,double r)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  size_type __n;
  long64 lVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  int local_6c;
  double dStack_68;
  int i;
  double a;
  double da;
  allocator<ClipperLib::IntPoint> local_46;
  undefined1 local_45;
  int local_44;
  int local_40;
  int n;
  long local_38;
  long64 steps;
  double r_local;
  double a2_local;
  double a1_local;
  IntPoint *pt_local;
  Polygon *result;
  
  n = 6;
  steps = (long64)r;
  r_local = a2;
  a2_local = a1;
  a1_local = (double)pt;
  pt_local = (IntPoint *)__return_storage_ptr__;
  dVar6 = sqrt(ABS(r));
  local_40 = (int)(dVar6 * ABS(r_local - a2_local));
  piVar3 = std::max<int>(&n,&local_40);
  local_38 = (long)*piVar3;
  if (0x100000 < local_38) {
    local_38 = 0x100000;
  }
  local_44 = (int)local_38;
  local_45 = 0;
  __n = (size_type)(int)local_38;
  std::allocator<ClipperLib::IntPoint>::allocator(&local_46);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            (__return_storage_ptr__,__n,&local_46);
  std::allocator<ClipperLib::IntPoint>::~allocator(&local_46);
  dVar6 = r_local - a2_local;
  iVar2 = local_44 + -1;
  dStack_68 = a2_local;
  for (local_6c = 0; local_6c < local_44; local_6c = local_6c + 1) {
    lVar1 = *(long *)a1_local;
    dVar7 = cos(dStack_68);
    lVar4 = Round(dVar7 * (double)steps);
    pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (__return_storage_ptr__,(long)local_6c);
    pvVar5->X = lVar1 + lVar4;
    lVar1 = *(long *)((long)a1_local + 8);
    dVar7 = ::sin(dStack_68);
    lVar4 = Round(dVar7 * (double)steps);
    pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (__return_storage_ptr__,(long)local_6c);
    pvVar5->Y = lVar1 + lVar4;
    dStack_68 = dVar6 / (double)iVar2 + dStack_68;
  }
  return __return_storage_ptr__;
}

Assistant:

Polygon BuildArc(const IntPoint &pt,
  const double a1, const double a2, const double r)
{
  long64 steps = std::max(6, int(std::sqrt(std::fabs(r)) * std::fabs(a2 - a1)));
  if (steps > 0x100000) steps = 0x100000;
  int n = (unsigned)steps;
  Polygon result(n);
  double da = (a2 - a1) / (n -1);
  double a = a1;
  for (int i = 0; i < n; ++i)
  {
    result[i].X = pt.X + Round(std::cos(a)*r);
    result[i].Y = pt.Y + Round(std::sin(a)*r);
    a += da;
  }
  return result;
}